

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLValidator::emitError
          (XMLValidator *this,Codes toEmit,char *text1,char *text2,char *text3,char *text4)

{
  XMLErrorReporter *pXVar1;
  long *plVar2;
  bool bVar3;
  ErrTypes EVar4;
  MemoryManager *pMVar5;
  Codes *pCVar6;
  undefined1 local_1068 [8];
  LastExtEntityInfo lastInfo;
  XMLCh errText [2048];
  XMLSize_t maxChars;
  char *text4_local;
  char *text3_local;
  char *text2_local;
  char *text1_local;
  Codes toEmit_local;
  XMLValidator *this_local;
  
  EVar4 = XMLValid::errorType(toEmit);
  if (EVar4 != ErrType_Warning) {
    XMLScanner::incrementErrorCount(this->fScanner);
  }
  plVar2 = sMsgLoader;
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    pMVar5 = XMLScanner::getMemoryManager(this->fScanner);
    (**(code **)(*plVar2 + 0x20))
              (plVar2,toEmit,&lastInfo.colNumber,0x7ff,text1,text2,text3,text4,pMVar5);
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)local_1068);
    ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,(LastExtEntityInfo *)local_1068);
    pXVar1 = this->fErrorReporter;
    EVar4 = XMLValid::errorType(toEmit);
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,(ulong)toEmit,XMLUni::fgValidityDomain,(ulong)EVar4,&lastInfo.colNumber,
               local_1068,lastInfo.systemId,lastInfo.publicId,lastInfo.lineNumber);
  }
  bVar3 = XMLValid::isError(toEmit);
  if ((((bVar3) && (bVar3 = XMLScanner::getValidationConstraintFatal(this->fScanner), bVar3)) ||
      (bVar3 = XMLValid::isFatal(toEmit), bVar3)) &&
     ((bVar3 = XMLScanner::getExitOnFirstFatal(this->fScanner), bVar3 &&
      (bVar3 = XMLScanner::getInException(this->fScanner), !bVar3)))) {
    pCVar6 = (Codes *)__cxa_allocate_exception(4);
    *pCVar6 = toEmit;
    __cxa_throw(pCVar6,&XMLValid::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XMLValidator::emitError(const  XMLValid::Codes toEmit
                            , const char* const     text1
                            , const char* const     text2
                            , const char* const     text3
                            , const char* const     text4)
{
    // Bump the error count if it is not a warning
    if (XMLValid::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
        fScanner->incrementErrorCount();

    //	Call error reporter if we have one
    if (fErrorReporter)
    {
        //
        //  Load the message into alocal and replace any tokens found in
        //  the text.
        //
        const XMLSize_t maxChars = 2047;
        XMLCh errText[maxChars + 1];

        // load the text
        if (!sMsgLoader->loadMsg(toEmit, errText, maxChars, text1, text2, text3, text4, fScanner->getMemoryManager()))
        {
          // <TBD> Should probably load a default message here
        }

        //
        //  Create a LastExtEntityInfo structure and get the reader manager
        //  to fill it in for us. This will give us the information about
        //  the last reader on the stack that was an external entity of some
        //  sort (i.e. it will ignore internal entities.
        //
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr->getLastExtEntityInfo(lastInfo);

        fErrorReporter->error
        (
            toEmit
            , XMLUni::fgValidityDomain
            , XMLValid::errorType(toEmit)
            , errText
            , lastInfo.systemId
            , lastInfo.publicId
            , lastInfo.lineNumber
            , lastInfo.colNumber
        );
    }

    // Bail out if its fatal an we are to give up on the first fatal error
    if (((XMLValid::isError(toEmit) && fScanner->getValidationConstraintFatal())
         || XMLValid::isFatal(toEmit))
    &&  fScanner->getExitOnFirstFatal()
    &&  !fScanner->getInException())
    {
        throw toEmit;
    }
}